

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

void opengv::printBearingVectorArraysMatlab
               (bearingVectors_t *bearingVectors1,bearingVectors_t *bearingVectors2)

{
  _Setprecision _Var1;
  size_type sVar2;
  ostream *poVar3;
  CoeffReturnType pdVar4;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t precision;
  size_t numberBearingVectors;
  Index in_stack_ffffffffffffff48;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_ffffffffffffff50;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  sVar2 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size(in_RDI);
  std::operator<<((ostream *)&std::cout,"ov1 = [");
  for (local_28 = 0; local_28 < sVar2; local_28 = local_28 + 1) {
    _Var1 = std::setprecision(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDI,local_28);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x3ce96f);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    _Var1 = std::setprecision(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDI,local_38);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x3cea30);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
    _Var1 = std::setprecision(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDI,local_48);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x3ceae4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"];");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"ov2 = [");
  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
    _Var1 = std::setprecision(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RSI,local_58);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x3ceba0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
    _Var1 = std::setprecision(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RSI,local_68);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0x3cec4b);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_78 = 0; local_78 < 8; local_78 = local_78 + 1) {
    _Var1 = std::setprecision(10);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RSI,local_78);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)poVar3,
                        in_stack_ffffffffffffff48,0x3cecf6);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar4);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"];");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
opengv::printBearingVectorArraysMatlab(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2 )
{
  size_t numberBearingVectors = bearingVectors1.size();

  //temp: print the vectors in matlab format (for debugging purposes)
  size_t precision = 10;
  std::cout << "ov1 = [";
  for( size_t i = 0; i < numberBearingVectors; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](0,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](1,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](2,0) << " ";
  std::cout << "];" << std::endl;
  std::cout << "ov2 = [";
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](0,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](1,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](2,0) << " ";
  std::cout << "];" << std::endl;
}